

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::DecommitNow(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              *this,bool all)

{
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  DWORD DVar7;
  FreePageEntry *__s;
  HANDLE pVVar8;
  unsigned_long *puVar9;
  ThreadContextId pvVar10;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar11;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar12;
  size_t sVar13;
  undefined8 *in_FS_OFFSET;
  byte local_149;
  size_t pageDecommitted_2;
  EditingIterator i_1;
  size_t pageDecommitted_1;
  size_t pageDecommitted;
  EditingIterator i;
  size_t decommitCount;
  size_t pageToDecommit;
  ulong local_88;
  size_t newFreePageCount;
  AutoCriticalSection local_70;
  AutoCriticalSection autoCS;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList;
  uint pageCount;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  FreePageEntry *freePageEntry;
  bool zeroPageQueueEmpty;
  long lStack_40;
  int numZeroPagesFreed;
  size_t deleteCount;
  bool all_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  bool local_19;
  bool local_9;
  
  uVar5 = (*this->_vptr_PageAllocatorBase[3])();
  if ((uVar5 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x797,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  lStack_40 = 0;
  if (((Js::Configuration::Global[0x2c158] & 1) != 0) && (bVar3 = HasZeroPageQueue(this), bVar3)) {
    bVar3 = false;
LAB_0031b34e:
    do {
      __s = PopPendingZeroPage(this);
      if (__s == (FreePageEntry *)0x0) goto code_r0x0031b365;
      if ((this->waitingToEnterIdleDecommit & 1U) != 0) goto LAB_0031b677;
      bVar4 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar4) {
        pvVar10 = GetCurrentThreadContextId();
        DVar7 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar7,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",this->debugName);
        }
        Output::Print(L"Freeing page from zero queue","");
        Output::Print(L"\n");
        bVar4 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar4) {
          (*this->_vptr_PageAllocatorBase[5])();
        }
        Output::Flush();
      }
      pPVar12 = __s->segment;
      uVar5 = __s->pageCount;
      autoCS.cs = (CriticalSection *)GetSegmentList(this,pPVar12);
      if ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
          autoCS.cs ==
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x7cb,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      if (all) {
        PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
                  (pPVar12,__s,uVar5);
        LogFreePages(this,(ulong)uVar5);
        LogDecommitPages(this,(ulong)uVar5);
        bVar4 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsAllDecommitted(pPVar12);
        if (bVar4) {
          LogFreePartiallyDecommittedPageSegment(this,pPVar12);
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          RemoveElement<Memory::NoThrowHeapAllocator>
                    ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                      *)autoCS.cs,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,pPVar12);
          lStack_40 = (ulong)this->maxAllocPageCount + lStack_40;
          goto LAB_0031b34e;
        }
      }
      else {
        pVVar1 = this->processHandle;
        pVVar8 = GetCurrentProcess();
        if (pVVar1 != pVVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x7e3,"(this->processHandle == GetCurrentProcess())",
                             "this->processHandle == GetCurrentProcess()");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        memset(__s,0,(ulong)(uVar5 << 0xc));
        PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages(pPVar12,__s,uVar5);
        LogFreePages(this,(ulong)uVar5);
      }
      TransferSegment(this,pPVar12,
                      (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                       *)autoCS.cs);
    } while( true );
  }
LAB_0031b779:
  if (this->freePageCount == 0) {
    if (this->debugMinFreePageCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x7fc,"(debugMinFreePageCount == 0)","debugMinFreePageCount == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  else {
    bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar3) {
      pvVar10 = GetCurrentThreadContextId();
      DVar7 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar7,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ",this->debugName);
      }
      Output::Print(L"Decommit now","");
      Output::Print(L"\n");
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar3) {
        (*this->_vptr_PageAllocatorBase[5])();
      }
      Output::Flush();
    }
    UpdateMinFreePageCount(this);
    if (all) {
      uVar6 = GetFreePageLimit();
      local_88 = (ulong)uVar6;
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar3) {
        pvVar10 = GetCurrentThreadContextId();
        DVar7 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar7,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",this->debugName);
        }
        Output::Print(L"Full decommit","");
        Output::Print(L"\n");
        bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar3) {
          (*this->_vptr_PageAllocatorBase[5])();
        }
        Output::Flush();
      }
    }
    else {
      if (this->freePageCount < this->minFreePageCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x811,"(this->minFreePageCount <= this->freePageCount)",
                           "this->minFreePageCount <= this->freePageCount");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      local_88 = this->freePageCount - (this->minFreePageCount >> 1);
      pageToDecommit = 0x1000;
      puVar9 = max<unsigned_long>(&local_88,&pageToDecommit);
      local_88 = *puVar9;
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar3) {
        pvVar10 = GetCurrentThreadContextId();
        DVar7 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar7,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",this->debugName);
        }
        Output::Print(L"Partial decommit","");
        Output::Print(L"\n");
        bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar3) {
          (*this->_vptr_PageAllocatorBase[5])();
        }
        Output::Flush();
      }
    }
    if (local_88 < this->freePageCount) {
      decommitCount = this->freePageCount - local_88;
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar3) {
        pvVar10 = GetCurrentThreadContextId();
        DVar7 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar7,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",this->debugName);
        }
        Output::Print(L"Decommit page count = %d",decommitCount);
        Output::Print(L"\n");
        bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar3) {
          (*this->_vptr_PageAllocatorBase[5])();
        }
        Output::Flush();
      }
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar3) {
        pvVar10 = GetCurrentThreadContextId();
        DVar7 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar7,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",this->debugName);
        }
        Output::Print(L"Free page count = %d",this->freePageCount);
        Output::Print(L"\n");
        bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar3) {
          (*this->_vptr_PageAllocatorBase[5])();
        }
        Output::Flush();
      }
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar3) {
        pvVar10 = GetCurrentThreadContextId();
        DVar7 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar7,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",this->debugName);
        }
        Output::Print(L"New free page count = %d",local_88);
        Output::Print(L"\n");
        bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar3) {
          (*this->_vptr_PageAllocatorBase[5])();
        }
        Output::Flush();
      }
      i.super_Iterator.current = (NodeBase *)0x0;
      DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
      EditingIterator::EditingIterator((EditingIterator *)&pageDecommitted,&this->decommitSegments);
      do {
        local_9 = false;
        if (decommitCount != 0) {
          if (i.super_Iterator.list ==
              (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
               *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                               ,0x66,"(current != nullptr)","current != nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          sVar13 = pageDecommitted;
          pDVar11 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    ::Next(&(i.super_Iterator.list)->
                            super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                          );
          local_9 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::IsHead((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                              *)sVar13,pDVar11);
          if (local_9) {
            i.super_Iterator.list =
                 (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  *)0x0;
          }
          else {
            i.super_Iterator.list =
                 (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  *)DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    ::Next(&(i.super_Iterator.list)->
                            super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                          );
          }
          local_9 = !local_9;
        }
        if (!local_9) break;
        pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)&pageDecommitted);
        sVar13 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                           (pPVar12,decommitCount);
        LogDecommitPages(this,sVar13);
        i.super_Iterator.current = (NodeBase *)((long)&(i.super_Iterator.current)->next + sVar13);
        pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)&pageDecommitted);
        uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetDecommitPageCount
                          (pPVar12);
        if (uVar6 == this->maxAllocPageCount) {
          pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::Iterator::Data((Iterator *)&pageDecommitted);
          LogFreePartiallyDecommittedPageSegment(this,pPVar12);
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          EditingIterator::RemoveCurrent<Memory::NoThrowHeapAllocator>
                    ((EditingIterator *)&pageDecommitted,
                     (NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
          lStack_40 = (ulong)this->maxAllocPageCount + lStack_40;
        }
        decommitCount = decommitCount - sVar13;
      } while ((this->waitingToEnterIdleDecommit & 1U) == 0);
      while( true ) {
        local_149 = 0;
        if (((this->waitingToEnterIdleDecommit & 1U) == 0) && (local_149 = 0, decommitCount != 0)) {
          bVar3 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Empty(&this->emptySegments);
          local_149 = bVar3 ^ 0xff;
        }
        if ((local_149 & 1) == 0) break;
        if (decommitCount < this->maxAllocPageCount) {
          pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::Head(&this->emptySegments);
          i_1.super_Iterator.current =
               (NodeBase *)
               PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                         (pPVar12,decommitCount);
          LogDecommitPages(this,(size_t)i_1.super_Iterator.current);
          i.super_Iterator.current =
               (NodeBase *)
               ((long)&(i.super_Iterator.current)->next + (long)&(i_1.super_Iterator.current)->next)
          ;
          if (i_1.super_Iterator.current != (NodeBase *)decommitCount) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x85d,"(pageDecommitted == pageToDecommit)",
                               "pageDecommitted == pageToDecommit");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          MoveHeadTo(&this->emptySegments,&this->decommitSegments);
          decommitCount = 0;
        }
        else {
          pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::Head(&this->emptySegments);
          uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetDecommitPageCount
                            (pPVar12);
          if (uVar6 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x84c,"(emptySegments.Head().GetDecommitPageCount() == 0)",
                               "emptySegments.Head().GetDecommitPageCount() == 0");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::Head(&this->emptySegments);
          LogFreeSegment(this,&pPVar12->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          RemoveHead<Memory::NoThrowHeapAllocator>
                    (&this->emptySegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
          decommitCount = decommitCount - this->maxAllocPageCount;
          i.super_Iterator.current =
               (NodeBase *)
               ((long)&(i.super_Iterator.current)->next + (ulong)this->maxAllocPageCount);
          lStack_40 = (ulong)this->maxAllocPageCount + lStack_40;
        }
      }
      if ((this->waitingToEnterIdleDecommit & 1U) == 0) {
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        EditingIterator::EditingIterator((EditingIterator *)&pageDecommitted_2,&this->segments);
        do {
          local_19 = false;
          if (decommitCount != 0) {
            if (i_1.super_Iterator.list ==
                (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                 *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)*in_FS_OFFSET = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                                 ,0x66,"(current != nullptr)","current != nullptr");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *(undefined4 *)*in_FS_OFFSET = 0;
            }
            sVar13 = pageDecommitted_2;
            pDVar11 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                      ::Next(&(i_1.super_Iterator.list)->
                              super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                            );
            local_19 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                       ::IsHead((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                                 *)sVar13,pDVar11);
            if (local_19) {
              i_1.super_Iterator.list =
                   (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    *)0x0;
            }
            else {
              i_1.super_Iterator.list =
                   (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    *)DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                      ::Next(&(i_1.super_Iterator.list)->
                              super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                            );
            }
            local_19 = !local_19;
          }
          if (!local_19) break;
          pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::Iterator::Data((Iterator *)&pageDecommitted_2);
          sVar13 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                             (pPVar12,decommitCount);
          LogDecommitPages(this,sVar13);
          i.super_Iterator.current = (NodeBase *)((long)&(i.super_Iterator.current)->next + sVar13);
          pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::Iterator::Data((Iterator *)&pageDecommitted_2);
          uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetDecommitPageCount
                            (pPVar12);
          if (uVar6 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x86e,"(i.Data().GetDecommitPageCount() != 0)",
                               "i.Data().GetDecommitPageCount() != 0");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          pPVar12 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                    ::Iterator::Data((Iterator *)&pageDecommitted_2);
          uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetDecommitPageCount
                            (pPVar12);
          if (this->maxAllocPageCount < uVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x86f,"(i.Data().GetDecommitPageCount() <= maxAllocPageCount)",
                               "i.Data().GetDecommitPageCount() <= maxAllocPageCount");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          EditingIterator::MoveCurrentTo
                    ((EditingIterator *)&pageDecommitted_2,&this->decommitSegments);
          decommitCount = decommitCount - sVar13;
        } while ((this->waitingToEnterIdleDecommit & 1U) == 0);
      }
      if ((decommitCount != 0) && ((this->waitingToEnterIdleDecommit & 1U) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x87b,"(pageToDecommit == 0 || this->waitingToEnterIdleDecommit)",
                           "pageToDecommit == 0 || this->waitingToEnterIdleDecommit");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      if ((decommitCount != 0) && ((this->waitingToEnterIdleDecommit & 1U) != 0)) {
        this->idleDecommitBackOffCount = this->idleDecommitBackOffCount + 1;
      }
      if (this->freePageCount != (long)&(i.super_Iterator.current)->next + decommitCount + local_88)
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x884,
                           "(this->freePageCount == newFreePageCount + decommitCount + pageToDecommit)"
                           ,
                           "this->freePageCount == newFreePageCount + decommitCount + pageToDecommit"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      this->freePageCount = local_88 + decommitCount;
      if (this->freePageCount < this->debugMinFreePageCount) {
        this->debugMinFreePageCount = this->freePageCount;
      }
      Check(this);
      this->decommitPageCount =
           (long)i.super_Iterator.current + (this->decommitPageCount - lStack_40);
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar3) {
        bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar3) {
          Output::Print(L" After decommit now:\n");
          (*this->_vptr_PageAllocatorBase[5])();
        }
        Output::Flush();
      }
    }
    else {
      bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if (bVar3) {
        pvVar10 = GetCurrentThreadContextId();
        DVar7 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar7,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ",this->debugName);
        }
        Output::Print(L"No pages to decommit","");
        Output::Print(L"\n");
        bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
        if (bVar3) {
          (*this->_vptr_PageAllocatorBase[5])();
        }
        Output::Flush();
      }
    }
  }
  return;
code_r0x0031b365:
  bVar3 = true;
LAB_0031b677:
  if (bVar3) {
    AutoCriticalSection::AutoCriticalSection
              (&local_70,&this->backgroundPageQueue->backgroundPageQueueCriticalSection);
    this->hasZeroQueuedPages = false;
    bVar3 = HasZeroQueuedPages(this);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x7f2,"(!this->HasZeroQueuedPages())","!this->HasZeroQueuedPages()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    AutoCriticalSection::~AutoCriticalSection(&local_70);
  }
  FlushBackgroundPages(this);
  goto LAB_0031b779;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::DecommitNow(bool all)
{
    Assert(!this->HasMultiThreadAccess());

#ifdef ENABLE_BASIC_TELEMETRY
    if (this->decommitStats != nullptr)
    {
        this->decommitStats->numDecommitCalls++;
        if (this->decommitStats->lastLeaveDecommitRegion.ToMicroseconds() > 0)
        {
            Js::TickDelta delta = Js::Tick::Now() - this->decommitStats->lastLeaveDecommitRegion;
            if (delta > this->decommitStats->maxDeltaBetweenDecommitRegionLeaveAndDecommit)
            {
                this->decommitStats->maxDeltaBetweenDecommitRegionLeaveAndDecommit = delta;
            }
        }
    }
#endif

    size_t deleteCount = 0;

#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // First, drain the zero page queue.
        // This will cause the free page count to be accurate
        if (HasZeroPageQueue())
        {
            int numZeroPagesFreed = 0;

            // There might be queued zero pages.  Drain them first
            bool zeroPageQueueEmpty = false;
            while (true)
            {
                FreePageEntry * freePageEntry = PopPendingZeroPage();
                if (freePageEntry == nullptr)
                {
                    zeroPageQueueEmpty = true;
                    break;
                }

                // Back-off from decommit if we are trying to enter IdleDecommit again.
                if (this->waitingToEnterIdleDecommit)
                {
                    break;
                }

                PAGE_ALLOC_TRACE_AND_STATS_0(_u("Freeing page from zero queue"));
                TPageSegment * segment = freePageEntry->segment;
                uint pageCount = freePageEntry->pageCount;

                numZeroPagesFreed += pageCount;

                DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
                Assert(fromSegmentList != nullptr);

                // Check for all here, since the actual free page count can't be determined
                // until we've flushed the zeroed page queue
                if (all)
                {
                    // Decommit them immediately if we are decommitting all pages.
                    segment->template DecommitPages<false>(freePageEntry, pageCount);
                    LogFreePages(pageCount);
                    LogDecommitPages(pageCount);

                    if (segment->IsAllDecommitted())
                    {
                        LogFreePartiallyDecommittedPageSegment(segment);
                        fromSegmentList->RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);

                        deleteCount += maxAllocPageCount;

                        continue;
                    }
                }
                else
                {
                    // Zero them and release them in case we don't decommit them.
                    Assert(this->processHandle == GetCurrentProcess());
                    memset(freePageEntry, 0, pageCount * AutoSystemInfo::PageSize);
                    segment->ReleasePages(freePageEntry, pageCount);
                    LogFreePages(pageCount);
                }

                TransferSegment(segment, fromSegmentList);
            }

            // Take the lock to make sure the recycler thread has finished zeroing out the pages after
            // we drained the queue
            if(zeroPageQueueEmpty)
            {
                AutoCriticalSection autoCS(&backgroundPageQueue->backgroundPageQueueCriticalSection);
                this->hasZeroQueuedPages = false;
                Assert(!this->HasZeroQueuedPages());
            }

            FlushBackgroundPages();
        }
    }
#endif

    if (this->freePageCount == 0)
    {
        Assert(debugMinFreePageCount == 0);
        return;
    }

    PAGE_ALLOC_TRACE_AND_STATS_0(_u("Decommit now"));

    // minFreePageCount is not updated on every page allocate,
    // so we have to do a final update here.
    UpdateMinFreePageCount();

    size_t newFreePageCount;

    if (all)
    {
        newFreePageCount = this->GetFreePageLimit();

        PAGE_ALLOC_TRACE_AND_STATS_0(_u("Full decommit"));
    }
    else
    {
        // Decommit half the min free page count since last partial decommit
        Assert(this->minFreePageCount <= this->freePageCount);
        newFreePageCount = this->freePageCount - (this->minFreePageCount / 2);

        // Ensure we don't decommit down to fewer than our partial decommit minimum
        newFreePageCount = max(newFreePageCount, static_cast<size_t>(MinPartialDecommitFreePageCount));

        PAGE_ALLOC_TRACE_AND_STATS_0(_u("Partial decommit"));
    }

    if (newFreePageCount >= this->freePageCount)
    {
        PAGE_ALLOC_TRACE_AND_STATS_0(_u("No pages to decommit"));
        return;
    }

    size_t pageToDecommit = this->freePageCount - newFreePageCount;

    PAGE_ALLOC_TRACE_AND_STATS(_u("Decommit page count = %d"), pageToDecommit);
    PAGE_ALLOC_TRACE_AND_STATS(_u("Free page count = %d"), this->freePageCount);
    PAGE_ALLOC_TRACE_AND_STATS(_u("New free page count = %d"), newFreePageCount);

    size_t decommitCount = 0;


    // decommit from page that already has other decommitted page already
    {
        typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

        while (pageToDecommit > 0  && i.Next())
        {
            size_t pageDecommitted = i.Data().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            if (i.Data().GetDecommitPageCount() == maxAllocPageCount)
            {
                LogFreePartiallyDecommittedPageSegment(&i.Data());
                i.RemoveCurrent(&NoThrowNoMemProtectHeapAllocator::Instance);

                deleteCount += maxAllocPageCount;

            }
            pageToDecommit -= pageDecommitted;

            // Back-off from decommit if we are trying to enter IdleDecommit again.
            if (this->waitingToEnterIdleDecommit)
            {
                break;
            }
        }
    }

    // decommit pages that are empty.
    // back-off from decommit if we are trying to enter IdleDecommit again.
    while (!this->waitingToEnterIdleDecommit && pageToDecommit > 0 && !emptySegments.Empty())
    {
        if (pageToDecommit >= maxAllocPageCount)
        {
            Assert(emptySegments.Head().GetDecommitPageCount() == 0);
            LogFreeSegment(&emptySegments.Head());
            emptySegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);

            pageToDecommit -= maxAllocPageCount;

            decommitCount += maxAllocPageCount;
            deleteCount += maxAllocPageCount;

        }
        else
        {
            size_t pageDecommitted = emptySegments.Head().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            Assert(pageDecommitted == pageToDecommit);
            emptySegments.MoveHeadTo(&decommitSegments);
            pageToDecommit = 0;
        }
    }

    if(!this->waitingToEnterIdleDecommit)
    {
        typename DListBase<TPageSegment>::EditingIterator i(&segments);

        while (pageToDecommit > 0  && i.Next())
        {
            size_t pageDecommitted = i.Data().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            Assert(i.Data().GetDecommitPageCount() != 0);
            Assert(i.Data().GetDecommitPageCount() <= maxAllocPageCount);
            i.MoveCurrentTo(&decommitSegments);
            pageToDecommit -= pageDecommitted;

            // Back-off from decommit if we are trying to enter IdleDecommit again.
            if (this->waitingToEnterIdleDecommit)
            {
                break;
            }
        }
    }

    Assert(pageToDecommit == 0 || this->waitingToEnterIdleDecommit);
#if DBG
    if (pageToDecommit != 0 && this->waitingToEnterIdleDecommit)
    {
        this->idleDecommitBackOffCount++;
    }
#endif

#if DBG_DUMP
    Assert(this->freePageCount == newFreePageCount + decommitCount + pageToDecommit);
#endif

    // If we had to back-off from decommiting then we may still have some free pages left to decommit.
    this->freePageCount = newFreePageCount + pageToDecommit;

#ifdef ENABLE_BASIC_TELEMETRY
    if (this->decommitStats != nullptr)
    {
        this->decommitStats->numPagesDecommitted += decommitCount;
        this->decommitStats->numFreePageCount += newFreePageCount + pageToDecommit;
    }
#endif

#if DBG
    UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
    Check();
#endif
#if DBG_DUMP
    this->decommitPageCount += (decommitCount - deleteCount);
    if (CUSTOM_PHASE_TRACE1(this->pageAllocatorFlagTable, Js::PageAllocatorPhase))
    {
        if (CUSTOM_PHASE_STATS1(this->pageAllocatorFlagTable, Js::PageAllocatorPhase))
        {
            Output::Print(_u(" After decommit now:\n"));
            this->DumpStats();
        }
        Output::Flush();
    }
#endif
}